

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  byte *pbVar5;
  xmlChar *pxVar6;
  byte *pbVar7;
  xmlXPathObjectPtr pxVar8;
  byte bVar9;
  xmlXPathCompExprPtr pxVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  xmlChar xVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  void *pvVar18;
  undefined8 local_48;
  void *local_40;
  double local_38;
  
  pbVar5 = ctxt->cur;
  pbVar7 = pbVar5;
  while( true ) {
    pbVar15 = pbVar7 + 1;
    bVar11 = *pbVar7;
    uVar12 = (ulong)bVar11;
    if (0x28 < uVar12) break;
    if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
      if ((0x11000000000U >> (uVar12 & 0x3f) & 1) != 0) goto switchD_001ba231_caseD_27;
      break;
    }
    ctxt->cur = pbVar15;
    pbVar5 = (byte *)(ulong)((int)pbVar5 + 1);
    pbVar7 = pbVar15;
  }
  if ((byte)(bVar11 - 0x30) < 10) goto switchD_001ba231_caseD_27;
  switch(bVar11) {
  case 0x27:
    break;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2c:
  case 0x2d:
switchD_001ba231_caseD_28:
    while (((byte)uVar12 < 0x21 && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0))) {
      ctxt->cur = pbVar15;
      bVar11 = *pbVar15;
      pbVar15 = pbVar15 + 1;
      pbVar5 = (byte *)(ulong)((int)pbVar5 + 1);
      uVar12 = (ulong)bVar11;
    }
    uVar1 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    if ((uVar1 < 0x3f) && ((0x4000800100000000U >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
LAB_001ba3b1:
      xmlXPathErr(ctxt,7);
      return;
    }
    if (uVar1 < 0x100) {
      if ((0x16 < uVar1 - 0xc0 && 0x19 < (uVar1 & 0xdf) - 0x41) &&
         (((uVar1 < 0xf8 && 0x1e < uVar1 - 0xd8 && ((char)uVar1 != '_')) && ((uVar1 & 0xff) != 0x3a)
          ))) goto LAB_001ba3b1;
    }
    else {
      iVar3 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
      if ((iVar3 == 0) && ((8 < uVar1 - 0x3021 && 0x51a5 < uVar1 - 0x4e00) && uVar1 != 0x3007))
      goto LAB_001ba3b1;
    }
    pbVar15 = pbVar15 + -1;
    while ((0x3e < uVar1 || ((0x4000800100000000U >> ((ulong)uVar1 & 0x3f) & 1) == 0))) {
      if (uVar1 < 0x100) {
        if ((0x16 < uVar1 - 0xc0 && 0x19 < (uVar1 & 0xdf) - 0x41) &&
           ((9 < uVar1 - 0x30 && 0x1e < uVar1 - 0xd8) && uVar1 < 0xf8)) {
LAB_001ba535:
          if ((0x32 < uVar1 - 0x2d) ||
             ((0x4000000002003U >> ((ulong)(uVar1 - 0x2d) & 0x3f) & 1) == 0)) {
            if (uVar1 < 0x100) {
              uVar1 = (uint)(uVar1 == 0xb7);
            }
            else {
              iVar3 = xmlCharInRange(uVar1,&xmlIsCombiningGroup);
              if (iVar3 != 0) goto LAB_001ba54e;
              uVar1 = xmlCharInRange(uVar1,&xmlIsExtenderGroup);
            }
            if (uVar1 == 0) break;
          }
        }
      }
      else {
        iVar3 = xmlCharInRange(uVar1,&xmlIsBaseCharGroup);
        if (((iVar3 == 0) && ((8 < uVar1 - 0x3021 && 0x51a5 < uVar1 - 0x4e00) && uVar1 != 0x3007))
           && (iVar3 = xmlCharInRange(uVar1,&xmlIsDigitGroup), iVar3 == 0)) goto LAB_001ba535;
      }
LAB_001ba54e:
      ctxt->cur = ctxt->cur + (int)local_48;
      uVar1 = xmlXPathCurrentChar(ctxt,(int *)&local_48);
    }
    pxVar6 = xmlStrndup(pbVar15,*(int *)&ctxt->cur - (int)pbVar5);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      ctxt->cur = pbVar15;
      goto LAB_001ba3b1;
    }
    ctxt->cur = pbVar15;
    pxVar4 = xmlStrstr(pxVar6,(xmlChar *)"::");
    if (pxVar4 == (xmlChar *)0x0) {
      iVar3 = xmlStrlen(pxVar6);
      lVar13 = (long)iVar3;
      do {
        xVar14 = ctxt->cur[lVar13];
        if (xVar14 != ' ') {
          bVar16 = false;
          if ((xVar14 == '\0') || (bVar16 = false, xVar14 == '/')) goto LAB_001ba64d;
          if ((1 < (byte)(xVar14 - 9)) && (xVar14 != '\r')) goto LAB_001ba62e;
        }
        lVar13 = lVar13 + 1;
      } while( true );
    }
    (*xmlFree)(pxVar6);
    pbVar7 = ctxt->cur;
    goto LAB_001ba242;
  case 0x2a:
  case 0x2f:
switchD_001ba231_caseD_2a:
    xmlXPathCompExprAdd(ctxt,-1,-1,bVar11 == 0x2f ^ XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
    pbVar5 = ctxt->cur;
    while( true ) {
      uVar12 = (ulong)*pbVar5;
      if (0x2f < uVar12) break;
      if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
        if (uVar12 == 0x2f) goto LAB_001ba2db;
        break;
      }
      ctxt->cur = pbVar5 + 1;
      pbVar5 = pbVar5 + 1;
    }
    goto LAB_001ba9c9;
  case 0x2e:
    if (9 < (byte)(*pbVar15 - 0x30)) goto LAB_001ba242;
    break;
  default:
    if (bVar11 == 0x40) goto switchD_001ba231_caseD_2a;
    if (bVar11 != 0x22) goto switchD_001ba231_caseD_28;
  }
switchD_001ba231_caseD_27:
  pbVar5 = pbVar7 + 1;
  bVar11 = *pbVar7;
  uVar12 = (ulong)bVar11;
  if (uVar12 < 0x29) {
    if ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0) goto LAB_001ba66f;
    if (uVar12 == 0x24) {
      ctxt->cur = pbVar5;
      pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
      if (pxVar6 != (xmlChar *)0x0) {
        ctxt->comp->last = -1;
        iVar3 = xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_VARIABLE,0,0,0,pxVar6,
                                    (void *)CONCAT44(local_48._4_4_,(int)local_48));
        if (iVar3 == -1) {
          (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
          (*xmlFree)(pxVar6);
        }
        pbVar5 = ctxt->cur;
        while( true ) {
          if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
          break;
          ctxt->cur = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
        }
        if ((ctxt->context != (xmlXPathContextPtr)0x0) && ((ctxt->context->flags & 2) != 0)) {
          iVar3 = 0x18;
          goto LAB_001bab15;
        }
        goto LAB_001bab1e;
      }
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
      iVar3 = 4;
      goto LAB_001bab15;
    }
    if (uVar12 == 0x28) goto LAB_001ba695;
  }
  if ((byte)(bVar11 - 0x30) < 10) {
LAB_001ba6b8:
    if (ctxt->error == 0) {
      if (bVar11 != 0x2e && bVar11 < 0x30) goto LAB_001ba6d8;
      pvVar18 = (void *)0x0;
      bVar16 = true;
      bVar11 = 0;
      while (bVar9 = (byte)uVar12, (byte)(bVar9 - 0x30) < 10) {
        ctxt->cur = pbVar5;
        pvVar18 = (void *)((double)pvVar18 * 10.0 + (double)(bVar9 & 0xf));
        bVar9 = *pbVar5;
        pbVar5 = pbVar5 + 1;
        bVar11 = 1;
        bVar16 = false;
        uVar12 = (ulong)bVar9;
      }
      if (bVar9 == 0x2e) {
        ctxt->cur = pbVar5;
        bVar9 = *pbVar5;
        if (bVar9 < 0x30) {
          if (!bVar16) {
LAB_001bab5c:
            uVar12 = 0;
            while (bVar9 == 0x30) {
              lVar13 = uVar12 + 1;
              ctxt->cur = pbVar5 + lVar13;
              uVar12 = uVar12 + 1;
              bVar9 = pbVar5[lVar13];
            }
            pbVar5 = pbVar5 + uVar12;
            iVar3 = (int)uVar12;
            local_38 = 0.0;
            while( true ) {
              pbVar5 = pbVar5 + 1;
              uVar1 = (uint)uVar12;
              if ((9 < (byte)(bVar9 - 0x30)) || (iVar3 + 0x14U <= uVar1)) break;
              local_38 = local_38 * 10.0 + (double)(int)(bVar9 - 0x30);
              uVar12 = (ulong)(uVar1 + 1);
              ctxt->cur = pbVar5;
              bVar9 = *pbVar5;
            }
            local_40 = pvVar18;
            dVar17 = pow(10.0,(double)(int)uVar1);
            pbVar5 = ctxt->cur;
            while (bVar9 = *pbVar5, (byte)(bVar9 - 0x30) < 10) {
              pbVar5 = pbVar5 + 1;
              ctxt->cur = pbVar5;
            }
            pvVar18 = (void *)((double)local_40 + local_38 / dVar17);
            goto LAB_001babf3;
          }
        }
        else if ((bool)(bVar11 | bVar9 < 0x3a)) goto LAB_001bab5c;
LAB_001ba6d8:
        iVar3 = 1;
        goto LAB_001bab15;
      }
      pbVar5 = pbVar5 + -1;
LAB_001babf3:
      if ((bVar9 | 0x20) == 0x65) {
        pbVar7 = pbVar5 + 1;
        ctxt->cur = pbVar7;
        bVar11 = pbVar5[1];
        if ((bVar11 != 0x2d) && (iVar3 = 0, bVar11 != 0x2b)) goto LAB_001bacbf;
        pbVar7 = pbVar5 + 2;
        iVar3 = 0;
        while( true ) {
          ctxt->cur = pbVar7;
LAB_001bacbf:
          if (9 < (byte)(*pbVar7 - 0x30)) break;
          if (iVar3 < 1000000) {
            iVar3 = iVar3 * 10 + -0x30 + (uint)*pbVar7;
          }
          pbVar7 = pbVar7 + 1;
        }
        iVar2 = -iVar3;
        if (bVar11 != 0x2d) {
          iVar2 = iVar3;
        }
        local_40 = pvVar18;
        dVar17 = pow(10.0,(double)iVar2);
        pvVar18 = (void *)((double)local_40 * dVar17);
      }
      pxVar8 = xmlXPathCacheNewFloat(ctxt,(double)pvVar18);
      if (pxVar8 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar3 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,3,0,0,pxVar8,(void *)0x0
                                   );
        if (iVar3 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar8);
        }
      }
    }
  }
  else if ((bVar11 == 0x22) || (bVar11 == 0x27)) {
    pxVar6 = xmlXPathParseLiteral(ctxt);
    if (pxVar6 != (xmlChar *)0x0) {
      pxVar8 = xmlXPathCacheNewString(ctxt,pxVar6);
      if (pxVar8 == (xmlXPathObjectPtr)0x0) {
        ctxt->error = 0xf;
      }
      else {
        iVar3 = xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_VALUE,4,0,0,pxVar8,(void *)0x0
                                   );
        if (iVar3 == -1) {
          xmlXPathReleaseObject(ctxt->context,pxVar8);
        }
      }
      (*xmlFree)(pxVar6);
    }
  }
  else {
    if ((bVar11 == 0x2e) && ((byte)(*pbVar5 - 0x30) < 10)) goto LAB_001ba6b8;
    pxVar6 = xmlXPathParseQName(ctxt,(xmlChar **)&local_48);
    if (pxVar6 == (xmlChar *)0x0) {
      (*xmlFree)((void *)CONCAT44(local_48._4_4_,(int)local_48));
    }
    else {
      uVar1 = 1;
      iVar3 = -1;
      pbVar5 = ctxt->cur;
      while( true ) {
        pbVar7 = pbVar5 + 1;
        uVar12 = (ulong)*pbVar5;
        if (0x28 < uVar12) break;
        if ((0x100002600U >> (uVar12 & 0x3f) & 1) == 0) {
          if (uVar12 == 0x28) goto LAB_001ba9fe;
          break;
        }
        ctxt->cur = pbVar7;
        pbVar5 = pbVar7;
      }
      (*xmlFree)(pxVar6);
      pvVar18 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
LAB_001bab10:
      (*xmlFree)(pvVar18);
    }
    iVar3 = 7;
LAB_001bab15:
    xmlXPathErr(ctxt,iVar3);
  }
  goto LAB_001bab1e;
LAB_001ba62e:
  if (xVar14 == '(') {
    iVar3 = xmlXPathIsNodeType(pxVar6);
    bVar16 = iVar3 == 0;
    xVar14 = ctxt->cur[lVar13];
  }
  else {
    bVar16 = false;
  }
LAB_001ba64d:
  (*xmlFree)(pxVar6);
  pbVar7 = ctxt->cur;
  if ((xVar14 == '\0') || (!bVar16)) {
LAB_001ba242:
    bVar11 = *pbVar7;
    goto switchD_001ba231_caseD_2a;
  }
  goto switchD_001ba231_caseD_27;
LAB_001ba2db:
  do {
    pbVar5 = ctxt->cur;
    if (*pbVar5 != 0x2f) break;
    if (pbVar5[1] == 0x2f) {
      pbVar5 = pbVar5 + 2;
      while( true ) {
        ctxt->cur = pbVar5;
        if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
        pbVar5 = pbVar5 + 1;
      }
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,(void *)0x0);
LAB_001ba372:
      xmlXPathCompRelativeLocationPath(ctxt);
    }
    else {
      do {
        pbVar5 = pbVar5 + 1;
        ctxt->cur = pbVar5;
        bVar11 = *pbVar5;
        uVar12 = (ulong)bVar11;
        if (0x20 < uVar12) goto LAB_001ba322;
      } while ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0);
      if (uVar12 != 0) {
LAB_001ba322:
        if ((((char)bVar11 < '\0') || ((byte)((bVar11 | 0x20) + 0x9f) < 0x1a)) ||
           ((bVar11 - 0x2a < 0x36 &&
            ((0x20000000400011U >> ((ulong)(bVar11 - 0x2a) & 0x3f) & 1) != 0)))) goto LAB_001ba372;
      }
    }
  } while (ctxt->error == 0);
  goto LAB_001ba9d1;
LAB_001ba66f:
  ctxt->cur = pbVar5;
  pbVar7 = pbVar5;
  goto switchD_001ba231_caseD_27;
LAB_001ba695:
  while( true ) {
    ctxt->cur = pbVar5;
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    pbVar5 = pbVar5 + 1;
  }
  xmlXPathCompileExpr(ctxt,1);
  if (ctxt->error == 0) {
    pbVar5 = ctxt->cur;
    if (*pbVar5 == 0x29) {
      do {
        pbVar5 = pbVar5 + 1;
        ctxt->cur = pbVar5;
        if (0x20 < (ulong)*pbVar5) break;
      } while ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0);
      goto LAB_001bab1e;
    }
    xmlXPathErr(ctxt,7);
  }
  goto LAB_001ba8b1;
LAB_001ba9fe:
  while( true ) {
    ctxt->cur = pbVar7;
    if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0)) break;
    pbVar7 = pbVar7 + 1;
  }
  local_40 = (void *)CONCAT44(local_48._4_4_,(int)local_48);
  if ((local_40 == (void *)0x0) && (*pxVar6 == 'c')) {
    iVar2 = xmlStrEqual(pxVar6,(xmlChar *)"count");
    uVar1 = (uint)(iVar2 == 0);
    pbVar7 = ctxt->cur;
  }
  pxVar10 = ctxt->comp;
  pxVar10->last = -1;
  uVar12 = (ulong)*pbVar7;
  iVar2 = 0;
  if (*pbVar7 != 0x29) {
    iVar2 = 0;
    while ((char)uVar12 != '\0') {
      iVar3 = pxVar10->last;
      pxVar10->last = -1;
      xmlXPathCompileExpr(ctxt,uVar1);
      if (ctxt->error != 0) {
        (*xmlFree)(pxVar6);
        (*xmlFree)(local_40);
        goto LAB_001bab1e;
      }
      xmlXPathCompExprAdd(ctxt,iVar3,ctxt->comp->last,XPATH_OP_ARG,0,0,0,(void *)0x0,(void *)0x0);
      iVar2 = iVar2 + 1;
      pbVar5 = ctxt->cur;
      if (*pbVar5 != 0x2c) {
        if (*pbVar5 != 0x29) {
          (*xmlFree)(pxVar6);
          pvVar18 = local_40;
          goto LAB_001bab10;
        }
        pxVar10 = ctxt->comp;
        break;
      }
      do {
        pbVar5 = pbVar5 + 1;
        ctxt->cur = pbVar5;
        uVar12 = (ulong)*pbVar5;
        if (0x20 < uVar12) break;
      } while ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0);
      pxVar10 = ctxt->comp;
    }
    iVar3 = pxVar10->last;
  }
  pvVar18 = local_40;
  iVar3 = xmlXPathCompExprAdd(ctxt,iVar3,-1,XPATH_OP_FUNCTION,iVar2,0,0,pxVar6,local_40);
  if (iVar3 == -1) {
    (*xmlFree)(pvVar18);
    (*xmlFree)(pxVar6);
  }
  pbVar5 = ctxt->cur;
  if (*pbVar5 != 0) goto LAB_001bad73;
  while (((ulong)*pbVar5 < 0x21 && ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
LAB_001bad73:
    pbVar5 = pbVar5 + 1;
    ctxt->cur = pbVar5;
  }
LAB_001bab1e:
  pbVar5 = ctxt->cur;
  while( true ) {
    if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
    ctxt->cur = pbVar5 + 1;
    pbVar5 = pbVar5 + 1;
  }
LAB_001ba8b1:
  if (ctxt->error == 0) {
    pbVar5 = ctxt->cur;
    while ((uVar12 = (ulong)*pbVar5, uVar12 < 0x21 && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0)))
    {
      pbVar5 = pbVar5 + 1;
      ctxt->cur = pbVar5;
    }
    while ((char)uVar12 == '[') {
      xmlXPathCompPredicate(ctxt,1);
      pbVar5 = ctxt->cur;
      while ((uVar12 = (ulong)*pbVar5, uVar12 < 0x21 && ((0x100002600U >> (uVar12 & 0x3f) & 1) != 0)
             )) {
        pbVar5 = pbVar5 + 1;
        ctxt->cur = pbVar5;
      }
    }
    if (ctxt->error == 0) {
      if ((char)uVar12 == '/') {
        if (pbVar5[1] == 0x2f) {
          pbVar5 = pbVar5 + 2;
          while( true ) {
            ctxt->cur = pbVar5;
            if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0))
            break;
            pbVar5 = pbVar5 + 1;
          }
          xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_COLLECT,6,1,0,(void *)0x0,
                              (void *)0x0);
        }
LAB_001ba9c9:
        xmlXPathCompRelativeLocationPath(ctxt);
      }
LAB_001ba9d1:
      pbVar5 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar5) || ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar5 + 1;
        pbVar5 = pbVar5 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompPathExpr(xmlXPathParserContextPtr ctxt) {
    int lc = 1;           /* Should we branch to LocationPath ?         */
    xmlChar *name = NULL; /* we may have to preparse a name to find out */

    SKIP_BLANKS;
    if ((CUR == '$') || (CUR == '(') ||
	(IS_ASCII_DIGIT(CUR)) ||
        (CUR == '\'') || (CUR == '"') ||
	(CUR == '.' && IS_ASCII_DIGIT(NXT(1)))) {
	lc = 0;
    } else if (CUR == '*') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '/') {
	/* relative or absolute location path */
	lc = 1;
    } else if (CUR == '@') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else if (CUR == '.') {
	/* relative abbreviated attribute location path */
	lc = 1;
    } else {
	/*
	 * Problem is finding if we have a name here whether it's:
	 *   - a nodetype
	 *   - a function call in which case it's followed by '('
	 *   - an axis in which case it's followed by ':'
	 *   - a element name
	 * We do an a priori analysis here rather than having to
	 * maintain parsed token content through the recursive function
	 * calls. This looks uglier but makes the code easier to
	 * read/write/debug.
	 */
	SKIP_BLANKS;
	name = xmlXPathScanName(ctxt);
	if ((name != NULL) && (xmlStrstr(name, (xmlChar *) "::") != NULL)) {
	    lc = 1;
	    xmlFree(name);
	} else if (name != NULL) {
	    int len =xmlStrlen(name);


	    while (NXT(len) != 0) {
		if (NXT(len) == '/') {
		    /* element name */
		    lc = 1;
		    break;
		} else if (IS_BLANK_CH(NXT(len))) {
		    /* ignore blanks */
		    ;
		} else if (NXT(len) == ':') {
		    lc = 1;
		    break;
		} else if ((NXT(len) == '(')) {
		    /* Node Type or Function */
		    if (xmlXPathIsNodeType(name)) {
			lc = 1;
		    } else {
			lc = 0;
		    }
                    break;
		} else if ((NXT(len) == '[')) {
		    /* element name */
		    lc = 1;
		    break;
		} else if ((NXT(len) == '<') || (NXT(len) == '>') ||
			   (NXT(len) == '=')) {
		    lc = 1;
		    break;
		} else {
		    lc = 1;
		    break;
		}
		len++;
	    }
	    if (NXT(len) == 0) {
		/* element name */
		lc = 1;
	    }
	    xmlFree(name);
	} else {
	    /* make sure all cases are covered explicitly */
	    XP_ERROR(XPATH_EXPR_ERROR);
	}
    }

    if (lc) {
	if (CUR == '/') {
	    PUSH_LEAVE_EXPR(XPATH_OP_ROOT, 0, 0);
	} else {
	    PUSH_LEAVE_EXPR(XPATH_OP_NODE, 0, 0);
	}
	xmlXPathCompLocationPath(ctxt);
    } else {
	xmlXPathCompFilterExpr(ctxt);
	CHECK_ERROR;
	if ((CUR == '/') && (NXT(1) == '/')) {
	    SKIP(2);
	    SKIP_BLANKS;

	    PUSH_LONG_EXPR(XPATH_OP_COLLECT, AXIS_DESCENDANT_OR_SELF,
		    NODE_TEST_TYPE, NODE_TYPE_NODE, NULL, NULL);

	    xmlXPathCompRelativeLocationPath(ctxt);
	} else if (CUR == '/') {
	    xmlXPathCompRelativeLocationPath(ctxt);
	}
    }
    SKIP_BLANKS;
}